

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

void changeLpCosts(HighsLp *lp,HighsIndexCollection *index_collection,
                  vector<double,_std::allocator<double>_> *new_col_cost,double infinite_cost)

{
  bool bVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  bool bVar6;
  HighsInt k;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  HighsInt to_k;
  HighsInt from_k;
  
  limits(index_collection,&from_k,&to_k);
  uVar7 = (ulong)from_k;
  if (from_k <= to_k) {
    bVar6 = index_collection->is_interval_;
    bVar1 = index_collection->is_mask_;
    piVar2 = (index_collection->set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (new_col_cost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0xffffffffffffffff;
    for (; (long)uVar7 <= (long)to_k; uVar7 = uVar7 + 1) {
      iVar9 = (int)uVar7;
      if (((bVar6 | bVar1) & 1U) == 0) {
        iVar9 = piVar2[uVar7];
      }
      uVar8 = (ulong)((int)uVar8 + 1);
      if ((bVar6 & 1U) == 0) {
        uVar8 = uVar7 & 0xffffffff;
      }
      if (((bVar1 & 1U) == 0) || (piVar3[iVar9] != 0)) {
        pdVar5[iVar9] = pdVar4[(int)uVar8];
      }
    }
    if (lp->has_infinite_cost_ != false) {
      bVar6 = HighsLp::hasInfiniteCost(lp,infinite_cost);
      lp->has_infinite_cost_ = bVar6;
    }
  }
  return;
}

Assistant:

void changeLpCosts(HighsLp& lp, const HighsIndexCollection& index_collection,
                   const vector<double>& new_col_cost,
                   const double infinite_cost) {
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  if (from_k > to_k) return;

  const bool& interval = index_collection.is_interval_;
  const bool& mask = index_collection.is_mask_;
  const vector<HighsInt>& col_set = index_collection.set_;
  const vector<HighsInt>& col_mask = index_collection.mask_;

  // Change the costs to the user-supplied costs, according to the technique
  HighsInt lp_col;
  HighsInt usr_col = -1;
  for (HighsInt k = from_k; k < to_k + 1; k++) {
    if (interval || mask) {
      lp_col = k;
    } else {
      lp_col = col_set[k];
    }
    HighsInt col = lp_col;
    if (interval) {
      usr_col++;
    } else {
      usr_col = k;
    }
    if (mask && !col_mask[col]) continue;
    lp.col_cost_[col] = new_col_cost[usr_col];
  }
  // Check whether the LP still has an infinite cost
  if (lp.has_infinite_cost_)
    lp.has_infinite_cost_ = lp.hasInfiniteCost(infinite_cost);
}